

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sm_manager.cc
# Opt level: O2

RC __thiscall
SM_Manager::GetRelEntry(SM_Manager *this,char *relName,RM_Record *relRec,RelCatEntry **entry)

{
  RC RVar1;
  RC RVar2;
  RM_FileScan fs;
  
  RM_FileScan::RM_FileScan(&fs);
  RVar1 = RM_FileScan::OpenScan(&fs,&this->relcatFH,STRING,0x19,0,EQ_OP,relName,NO_HINT);
  if (RVar1 == 0) {
    RVar2 = RM_FileScan::GetNextRec(&fs,relRec);
    RVar1 = 0x12e;
    if (RVar2 == 0) {
      RVar1 = RM_FileScan::CloseScan(&fs);
      if (RVar1 == 0) {
        RVar1 = RM_Record::GetData(relRec,(char **)entry);
      }
    }
  }
  RM_FileScan::~RM_FileScan(&fs);
  return RVar1;
}

Assistant:

RC SM_Manager::GetRelEntry(const char *relName, RM_Record &relRec, RelCatEntry *&entry){
  RC rc = 0;
  // Use a scan to search for it
  RM_FileScan fs;
  if((rc = fs.OpenScan(relcatFH, STRING, MAXNAME+1, 0, EQ_OP, const_cast<char*>(relName))))
    return (rc);
  if((rc = fs.GetNextRec(relRec))) // there should be only one entry
    return (SM_BADRELNAME);
  
  if((rc = fs.CloseScan())) 
    return (rc);

  if((rc = relRec.GetData((char *&)entry))) // retrieve its data contents
    return (rc);

  return (0);
}